

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_12x6(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  DCTELEM *pDVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar58;
  undefined1 auVar36 [16];
  int iVar59;
  undefined1 auVar37 [16];
  int iVar60;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar61;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  long lVar45;
  int iVar62;
  undefined1 auVar47 [16];
  int iVar63;
  ulong uVar48;
  int iVar50;
  int iVar52;
  undefined1 auVar49 [16];
  ulong uVar51;
  undefined1 auVar54 [16];
  ulong uVar55;
  undefined1 auVar56 [16];
  ulong uVar57;
  long lStack_70;
  long lVar41;
  long lVar42;
  long lVar44;
  long lVar46;
  long lVar53;
  
  *(undefined1 (*) [16])(data + 0x3c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x38) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x34) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x30) = (undefined1  [16])0x0;
  uVar31 = (ulong)start_col;
  lVar20 = 0;
  do {
    lVar17 = *(long *)((long)sample_data + lVar20);
    bVar8 = *(byte *)(lVar17 + 0xb + uVar31);
    uVar35 = (ulong)((uint)*(byte *)(lVar17 + uVar31) + (uint)bVar8);
    bVar9 = *(byte *)(lVar17 + 1 + uVar31);
    bVar10 = *(byte *)(lVar17 + 2 + uVar31);
    bVar11 = *(byte *)(lVar17 + 9 + uVar31);
    uVar33 = (ulong)((uint)bVar10 + (uint)bVar11);
    bVar12 = *(byte *)(lVar17 + 3 + uVar31);
    bVar13 = *(byte *)(lVar17 + 8 + uVar31);
    uVar34 = (ulong)((uint)bVar12 + (uint)bVar13);
    bVar14 = *(byte *)(lVar17 + 5 + uVar31);
    bVar15 = *(byte *)(lVar17 + 6 + uVar31);
    uVar48 = (ulong)((uint)bVar14 + (uint)bVar15);
    lVar18 = uVar48 + uVar35;
    lVar28 = uVar35 - uVar48;
    lVar19 = uVar34 + uVar33;
    lVar21 = uVar33 - uVar34;
    bVar16 = *(byte *)(lVar17 + 10 + uVar31);
    lVar29 = (ulong)*(byte *)(lVar17 + uVar31) - (ulong)bVar8;
    uVar30 = (uint)bVar9 + (uint)bVar16;
    lVar27 = (ulong)bVar9 - (ulong)bVar16;
    lVar23 = (ulong)bVar10 - (ulong)bVar11;
    bVar8 = *(byte *)(lVar17 + 4 + uVar31);
    bVar9 = *(byte *)(lVar17 + 7 + uVar31);
    lVar26 = (ulong)bVar12 - (ulong)bVar13;
    uVar22 = (uint)bVar8 + (uint)bVar9;
    lVar24 = (ulong)bVar8 - (ulong)bVar9;
    lVar25 = (ulong)bVar14 - (ulong)bVar15;
    lVar17 = (ulong)uVar30 - (ulong)uVar22;
    data[lVar20] = ((int)lVar18 + uVar22 + uVar30 + (int)lVar19) * 4 + -0x1800;
    data[lVar20 + 6] = (((int)lVar28 - (int)lVar17) - (int)lVar21) * 4;
    data[lVar20 + 4] = (DCTELEM)((lVar18 - lVar19) * 0x2731 + 0x400U >> 0xb);
    data[lVar20 + 2] = (DCTELEM)((ulong)(lVar17 + lVar21 * 0x2bb5 + 0x400 + lVar28 * 0x2bb6) >> 0xb)
    ;
    lVar18 = (lVar24 + lVar27) * 0x1151;
    lVar27 = lVar27 * 0x187e + lVar18;
    lVar18 = lVar24 * -0x3b21 + lVar18;
    lVar19 = (lVar29 + lVar23) * 0x23e7;
    lVar17 = (lVar26 + lVar29) * 0x1b8d;
    data[lVar20 + 1] =
         (DCTELEM)((ulong)(lVar25 * 0x5e8 + lVar27 +
                          lVar29 * 0x7ffffffed6a + lVar19 + 0x400 + lVar17) >> 0xb);
    data[lVar20 + 3] =
         (DCTELEM)((lVar25 + lVar23) * 0x7ffffffeeaf + (lVar29 - lVar26) * 0x29cf + lVar18 + 0x400U
                  >> 0xb);
    lVar21 = (lVar26 + lVar23) * -0x5e8;
    data[lVar20 + 5] =
         (DCTELEM)((ulong)(((lVar19 + lVar23 * -0x4add + 0x400 + lVar21) - lVar18) + lVar25 * 0x1b8d
                          ) >> 0xb);
    data[lVar20 + 7] =
         (DCTELEM)((ulong)(lVar25 * 0x7ffffffdc19 + 0x400 +
                          ((lVar26 * 0x173a + lVar17 + lVar21) - lVar27)) >> 0xb);
    lVar20 = lVar20 + 8;
  } while (lVar20 != 0x30);
  lVar20 = -8;
  do {
    piVar5 = data + lVar20 + 0x30;
    piVar1 = data + lVar20 + 8;
    piVar2 = data + lVar20 + 0x10;
    piVar3 = data + lVar20 + 0x18;
    piVar6 = data + lVar20 + 0x20;
    iVar63 = *piVar5 + *piVar1;
    auVar49._4_4_ = piVar5[1] + piVar1[1];
    iVar50 = piVar5[2] + piVar1[2];
    iVar52 = piVar5[3] + piVar1[3];
    auVar32._4_4_ = iVar52;
    auVar32._0_4_ = iVar50;
    auVar32._8_4_ = iVar52;
    auVar32._12_4_ = -(uint)(iVar52 < 0);
    lVar18 = CONCAT44(-(uint)(iVar50 < 0),iVar50);
    auVar49._8_4_ = auVar49._4_4_;
    auVar49._12_4_ = -(uint)(auVar49._4_4_ < 0);
    lVar23 = CONCAT44(-(uint)(iVar63 < 0),iVar63);
    piVar7 = data + lVar20 + 0x28;
    iVar62 = *piVar7 + *piVar2;
    auVar47._4_4_ = piVar7[1] + piVar2[1];
    iVar50 = piVar7[2] + piVar2[2];
    iVar52 = piVar7[3] + piVar2[3];
    auVar54._4_4_ = iVar52;
    auVar54._0_4_ = iVar50;
    auVar54._8_4_ = iVar52;
    auVar54._12_4_ = -(uint)(iVar52 < 0);
    lVar53 = CONCAT44(-(uint)(iVar50 < 0),iVar50);
    auVar47._8_4_ = auVar47._4_4_;
    auVar47._12_4_ = -(uint)(auVar47._4_4_ < 0);
    lVar46 = CONCAT44(-(uint)(iVar62 < 0),iVar62);
    iVar60 = *piVar6 + *piVar3;
    auVar38._4_4_ = piVar6[1] + piVar3[1];
    iVar50 = piVar6[2] + piVar3[2];
    iVar52 = piVar6[3] + piVar3[3];
    auVar56._4_4_ = iVar52;
    auVar56._0_4_ = iVar50;
    auVar56._8_4_ = iVar52;
    auVar56._12_4_ = -(uint)(iVar52 < 0);
    lVar24 = CONCAT44(-(uint)(iVar50 < 0),iVar50);
    auVar38._8_4_ = auVar38._4_4_;
    auVar38._12_4_ = -(uint)(auVar38._4_4_ < 0);
    lVar21 = CONCAT44(-(uint)(iVar60 < 0),iVar60);
    lVar29 = lVar21 + lVar23;
    lVar45 = auVar38._8_8_ + auVar49._8_8_;
    lVar19 = lVar24 + lVar18;
    lVar17 = auVar56._8_8_ + auVar32._8_8_;
    uVar31 = lVar18 - lVar24;
    uVar33 = auVar32._8_8_ - auVar56._8_8_;
    uVar48 = lVar23 - lVar21;
    uVar51 = auVar49._8_8_ - auVar38._8_8_;
    iVar59 = *piVar1 - *piVar5;
    auVar37._4_4_ = piVar1[1] - piVar5[1];
    iVar50 = piVar1[2] - piVar5[2];
    iVar52 = piVar1[3] - piVar5[3];
    auVar43._4_4_ = iVar52;
    auVar43._0_4_ = iVar50;
    auVar43._8_4_ = iVar52;
    auVar43._12_4_ = -(uint)(iVar52 < 0);
    lVar44 = auVar43._8_8_;
    lVar42 = CONCAT44(-(uint)(iVar50 < 0),iVar50);
    auVar37._8_4_ = auVar37._4_4_;
    auVar37._12_4_ = -(uint)(auVar37._4_4_ < 0);
    lVar25 = auVar37._8_8_;
    lVar24 = CONCAT44(-(uint)(iVar59 < 0),iVar59);
    iVar61 = *piVar2 - *piVar7;
    auVar40._4_4_ = piVar2[1] - piVar7[1];
    iVar50 = piVar2[2] - piVar7[2];
    auVar40._8_4_ = auVar40._4_4_;
    auVar40._12_4_ = -(uint)(auVar40._4_4_ < 0);
    lVar41 = auVar40._8_8_;
    lVar28 = CONCAT44(-(uint)(iVar61 < 0),iVar61);
    lVar18 = CONCAT44(-(uint)(iVar50 < 0),iVar50);
    iVar58 = *piVar3 - *piVar6;
    auVar36._4_4_ = piVar3[1] - piVar6[1];
    iVar50 = piVar3[2] - piVar6[2];
    iVar52 = piVar3[3] - piVar6[3];
    auVar39._4_4_ = iVar52;
    auVar39._0_4_ = iVar50;
    auVar39._8_4_ = iVar52;
    auVar39._12_4_ = -(uint)(iVar52 < 0);
    lVar27 = auVar39._8_8_;
    lVar26 = CONCAT44(-(uint)(iVar50 < 0),iVar50);
    auVar36._8_4_ = auVar36._4_4_;
    auVar36._12_4_ = -(uint)(auVar36._4_4_ < 0);
    lVar23 = auVar36._8_8_;
    lVar21 = CONCAT44(-(uint)(iVar58 < 0),iVar58);
    uVar34 = lVar19 + lVar53;
    uVar35 = lVar17 + auVar54._8_8_;
    uVar55 = lVar29 + lVar46;
    uVar57 = lVar45 + auVar47._8_8_;
    pDVar4 = data + lVar20 + 8;
    *pDVar4 = (DCTELEM)((uVar55 & 0xffffffff) * 0x38e4 + 0x8000 +
                        ((uVar55 >> 0x20) * 0x38e4 << 0x20) >> 0x10);
    pDVar4[1] = (DCTELEM)((uVar57 & 0xffffffff) * 0x38e4 + 0x8000 +
                          ((uVar57 >> 0x20) * 0x38e4 << 0x20) >> 0x10);
    pDVar4[2] = (DCTELEM)((uVar34 & 0xffffffff) * 0x38e4 + 0x8000 +
                          ((uVar34 >> 0x20) * 0x38e4 << 0x20) >> 0x10);
    pDVar4[3] = (DCTELEM)((uVar35 & 0xffffffff) * 0x38e4 + 0x8000 +
                          ((uVar35 >> 0x20) * 0x38e4 << 0x20) >> 0x10);
    pDVar4 = data + lVar20 + 0x18;
    *pDVar4 = (DCTELEM)((uVar48 & 0xffffffff) * 0x45ad + 0x8000 +
                        ((uVar48 >> 0x20) * 0x45ad << 0x20) >> 0x10);
    pDVar4[1] = (DCTELEM)((uVar51 & 0xffffffff) * 0x45ad + 0x8000 +
                          ((uVar51 >> 0x20) * 0x45ad << 0x20) >> 0x10);
    pDVar4[2] = (DCTELEM)((uVar31 & 0xffffffff) * 0x45ad + 0x8000 +
                          ((uVar31 >> 0x20) * 0x45ad << 0x20) >> 0x10);
    pDVar4[3] = (DCTELEM)((uVar33 & 0xffffffff) * 0x45ad + 0x8000 +
                          ((uVar33 >> 0x20) * 0x45ad << 0x20) >> 0x10);
    uVar31 = lVar19 + lVar53 * -2;
    uVar33 = lVar17 + auVar54._8_8_ * -2;
    uVar34 = lVar29 + lVar46 * -2;
    uVar35 = lVar45 + auVar47._8_8_ * -2;
    pDVar4 = data + lVar20 + 0x28;
    *pDVar4 = (DCTELEM)((uVar34 & 0xffffffff) * 0x283a + 0x8000 +
                        ((uVar34 >> 0x20) * 0x283a << 0x20) >> 0x10);
    pDVar4[1] = (DCTELEM)((uVar35 & 0xffffffff) * 0x283a + 0x8000 +
                          ((uVar35 >> 0x20) * 0x283a << 0x20) >> 0x10);
    pDVar4[2] = (DCTELEM)((uVar31 & 0xffffffff) * 0x283a + 0x8000 +
                          ((uVar31 >> 0x20) * 0x283a << 0x20) >> 0x10);
    pDVar4[3] = (DCTELEM)((uVar33 & 0xffffffff) * 0x283a + 0x8000 +
                          ((uVar33 >> 0x20) * 0x283a << 0x20) >> 0x10);
    lVar29 = (lVar21 + lVar24 & 0xffffffffU) * 0x14d3 + 0x8000 +
             (((ulong)(lVar21 + lVar24) >> 0x20) * 0x14d3 << 0x20);
    lVar45 = (lVar23 + lVar25 & 0xffffffffU) * 0x14d3 + 0x8000 +
             (((ulong)(lVar23 + lVar25) >> 0x20) * 0x14d3 << 0x20);
    lVar19 = (lVar26 + lVar42 & 0xffffffffU) * 0x14d3 + 0x8000 +
             (((ulong)(lVar26 + lVar42) >> 0x20) * 0x14d3 << 0x20);
    lVar17 = (lVar27 + lVar44 & 0xffffffffU) * 0x14d3 + 0x8000 +
             (((ulong)(lVar27 + lVar44) >> 0x20) * 0x14d3 << 0x20);
    pDVar4 = data + lVar20 + 0x10;
    *pDVar4 = (DCTELEM)((((ulong)(lVar28 + lVar24) >> 0x20) * 0x38e4 << 0x20) +
                        (lVar28 + lVar24 & 0xffffffffU) * 0x38e4 + lVar29 >> 0x10);
    pDVar4[1] = (DCTELEM)((((ulong)(lVar41 + lVar25) >> 0x20) * 0x38e4 << 0x20) +
                          (lVar41 + lVar25 & 0xffffffffU) * 0x38e4 + lVar45 >> 0x10);
    pDVar4[2] = (DCTELEM)((((ulong)(lVar18 + lVar42) >> 0x20) * 0x38e4 << 0x20) +
                          (lVar18 + lVar42 & 0xffffffffU) * 0x38e4 + lVar19 >> 0x10);
    pDVar4[3] = (DCTELEM)((((ulong)(lStack_70 + lVar44) >> 0x20) * 0x38e4 << 0x20) +
                          (lStack_70 + lVar44 & 0xffffffffU) * 0x38e4 + lVar17 >> 0x10);
    uVar34 = lVar42 - (lVar18 + lVar26);
    uVar35 = lVar44 - (lStack_70 + lVar27);
    uVar31 = lVar24 - (lVar28 + lVar21);
    uVar33 = lVar25 - (lVar41 + lVar23);
    pDVar4 = data + lVar20 + 0x20;
    *pDVar4 = (DCTELEM)((uVar31 & 0xffffffff) * 0x38e4 + 0x8000 +
                        ((uVar31 >> 0x20) * 0x38e4 << 0x20) >> 0x10);
    pDVar4[1] = (DCTELEM)((uVar33 & 0xffffffff) * 0x38e4 + 0x8000 +
                          ((uVar33 >> 0x20) * 0x38e4 << 0x20) >> 0x10);
    pDVar4[2] = (DCTELEM)((uVar34 & 0xffffffff) * 0x38e4 + 0x8000 +
                          ((uVar34 >> 0x20) * 0x38e4 << 0x20) >> 0x10);
    pDVar4[3] = (DCTELEM)((uVar35 & 0xffffffff) * 0x38e4 + 0x8000 +
                          ((uVar35 >> 0x20) * 0x38e4 << 0x20) >> 0x10);
    pDVar4 = data + lVar20 + 0x30;
    *pDVar4 = (DCTELEM)((((ulong)(lVar21 - lVar28) >> 0x20) * 0x38e4 << 0x20) +
                        (lVar21 - lVar28 & 0xffffffffU) * 0x38e4 + lVar29 >> 0x10);
    pDVar4[1] = (DCTELEM)((((ulong)(lVar23 - lVar41) >> 0x20) * 0x38e4 << 0x20) +
                          (lVar23 - lVar41 & 0xffffffffU) * 0x38e4 + lVar45 >> 0x10);
    pDVar4[2] = (DCTELEM)((((ulong)(lVar26 - lVar18) >> 0x20) * 0x38e4 << 0x20) +
                          (lVar26 - lVar18 & 0xffffffffU) * 0x38e4 + lVar19 >> 0x10);
    pDVar4[3] = (DCTELEM)((((ulong)(lVar27 - lStack_70) >> 0x20) * 0x38e4 << 0x20) +
                          (lVar27 - lStack_70 & 0xffffffffU) * 0x38e4 + lVar17 >> 0x10);
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_12x6 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Zero 2 bottom rows of output coefficient block. */
  MEMZERO(&data[DCTSIZE*6], SIZEOF(DCTELEM) * DCTSIZE * 2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 12-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/24). */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[6]);

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 12 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[6] = (DCTELEM) ((tmp13 - tmp14 - tmp15) << PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.224744871)), /* c4 */
	      CONST_BITS-PASS1_BITS);
    dataptr[2] = (DCTELEM)
      DESCALE(tmp14 - tmp15 + MULTIPLY(tmp13 + tmp15, FIX(1.366025404)), /* c2 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX_0_541196100);    /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX_0_765366865);   /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX_1_847759065);   /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.121971054));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.860918669));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.580774953)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.184591911));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.184591911)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.339493912)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.860918669));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.725788011)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(1.121971054));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.306562965)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX_0_541196100);  /* c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/12)*(8/6) = 8/9, which we
   * partially fold into the constant multipliers and final shifting:
   * 6-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/12) * 16/9.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*5];
    tmp11 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*3];

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11, FIX(1.777777778)),         /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(2.177324216)),                 /* c2 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(1.257078722)), /* c4 */
	      CONST_BITS+PASS1_BITS+1);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp2, FIX(0.650711829));             /* c5 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp2, FIX(1.777777778)),    /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp2 - tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);

    dataptr++;			/* advance pointer to next column */
  }
}